

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

AggregateFunction * duckdb::GetEntropyFunction(LogicalType *type)

{
  PhysicalType PVar1;
  LogicalType *in_RSI;
  AggregateFunction *in_RDI;
  LogicalType *in_stack_00000028;
  LogicalType *in_stack_000000f8;
  
  PVar1 = LogicalType::InternalType(in_RSI);
  switch(PVar1) {
  case UINT16:
    GetTypedEntropyFunction<unsigned_short,duckdb::ModeStandard<unsigned_short>>(in_stack_00000028);
    break;
  case INT16:
    GetTypedEntropyFunction<short,duckdb::ModeStandard<short>>(in_stack_00000028);
    break;
  case UINT32:
    GetTypedEntropyFunction<unsigned_int,duckdb::ModeStandard<unsigned_int>>(in_stack_00000028);
    break;
  case INT32:
    GetTypedEntropyFunction<int,duckdb::ModeStandard<int>>(in_stack_00000028);
    break;
  case UINT64:
    GetTypedEntropyFunction<unsigned_long,duckdb::ModeStandard<unsigned_long>>(in_stack_00000028);
    break;
  case INT64:
    GetTypedEntropyFunction<long,duckdb::ModeStandard<long>>(in_stack_00000028);
    break;
  case FLOAT:
    GetTypedEntropyFunction<float,duckdb::ModeStandard<float>>(in_stack_00000028);
    break;
  case DOUBLE:
    GetTypedEntropyFunction<double,duckdb::ModeStandard<double>>(in_stack_00000028);
    break;
  case VARCHAR:
    GetTypedEntropyFunction<duckdb::string_t,duckdb::ModeString>(in_stack_00000028);
    break;
  default:
    GetFallbackEntropyFunction(in_stack_000000f8);
  }
  return in_RDI;
}

Assistant:

AggregateFunction GetEntropyFunction(const LogicalType &type) {
	switch (type.InternalType()) {
#ifndef DUCKDB_SMALLER_BINARY
	case PhysicalType::UINT16:
		return GetTypedEntropyFunction<uint16_t>(type);
	case PhysicalType::UINT32:
		return GetTypedEntropyFunction<uint32_t>(type);
	case PhysicalType::UINT64:
		return GetTypedEntropyFunction<uint64_t>(type);
	case PhysicalType::INT16:
		return GetTypedEntropyFunction<int16_t>(type);
	case PhysicalType::INT32:
		return GetTypedEntropyFunction<int32_t>(type);
	case PhysicalType::INT64:
		return GetTypedEntropyFunction<int64_t>(type);
	case PhysicalType::FLOAT:
		return GetTypedEntropyFunction<float>(type);
	case PhysicalType::DOUBLE:
		return GetTypedEntropyFunction<double>(type);
	case PhysicalType::VARCHAR:
		return GetTypedEntropyFunction<string_t, ModeString>(type);
#endif
	default:
		return GetFallbackEntropyFunction(type);
	}
}